

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::msgpack::basic_msgpack_cursor<jsoncons::bytes_source,_std::allocator<char>_>::reset
          (basic_msgpack_cursor<jsoncons::bytes_source,_std::allocator<char>_> *this)

{
  uint uVar1;
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *in_RDI;
  basic_staj_visitor<char> *in_stack_00000030;
  
  basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_>::reset
            ((basic_msgpack_parser<jsoncons::bytes_source,_std::allocator<char>_> *)in_RDI);
  basic_staj_visitor<char>::reset(in_stack_00000030);
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset(in_RDI);
  in_RDI[2].key_.field_2._M_local_buf[8] = '\0';
  uVar1 = (*(in_RDI->super_basic_item_event_visitor<char>)._vptr_basic_item_event_visitor[3])();
  if ((uVar1 & 1) == 0) {
    (*(in_RDI->super_basic_item_event_visitor<char>)._vptr_basic_item_event_visitor[7])();
  }
  return;
}

Assistant:

void reset()
    {
        parser_.reset();
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next();
        }
    }